

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_generic_iterator_t
xcb_input_device_resolution_state_resolution_max_end(xcb_input_device_resolution_state_t *R)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  xcb_generic_iterator_t xVar2;
  xcb_generic_iterator_t prev;
  xcb_generic_iterator_t i;
  xcb_input_device_resolution_state_t *in_stack_ffffffffffffffc8;
  int local_30;
  void *local_28;
  int iStack_1c;
  int local_18;
  long lStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  xVar2 = xcb_input_device_resolution_state_resolution_min_end(in_stack_ffffffffffffffc8);
  local_28 = xVar2.data;
  iStack_1c = xVar2.index;
  local_28 = (void *)((long)local_28 + (ulong)*(uint *)(in_RDI + 4) * 4 + (ulong)(-iStack_1c & 3));
  local_18 = (int)local_28;
  local_30 = (int)in_RDI;
  lStack_10 = (ulong)(uint)(local_18 - local_30) << 0x20;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    xVar2.rem = (undefined4)lStack_10;
    xVar2.index = lStack_10._4_4_;
    xVar2.data = local_28;
    return xVar2;
  }
  __stack_chk_fail();
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_resolution_state_resolution_max_end (const xcb_input_device_resolution_state_t *R)
{
    xcb_generic_iterator_t i;
    xcb_generic_iterator_t prev = xcb_input_device_resolution_state_resolution_min_end(R);
    i.data = ((uint32_t *) ((char*) prev.data + XCB_TYPE_PAD(uint32_t, prev.index))) + (R->num_valuators);
    i.rem = 0;
    i.index = (char *) i.data - (char *) R;
    return i;
}